

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkXpansByAliases
          (Registry *this,StringArray *aAliases,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aRet,StringArray *aUnresolved)

{
  Status SVar1;
  bool bVar2;
  reference pNVar3;
  Network *nwk;
  iterator __end3;
  iterator __begin3;
  NetworkArray *__range3;
  undefined1 local_40 [7];
  Status status;
  NetworkArray networks;
  StringArray *aUnresolved_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *aRet_local;
  StringArray *aAliases_local;
  Registry *this_local;
  
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aUnresolved;
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            *)local_40);
  SVar1 = GetNetworksByAliases
                    (this,aAliases,
                     (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)local_40,
                     (StringArray *)
                     networks.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (SVar1 == kSuccess) {
    __end3 = std::
             vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)local_40);
    nwk = (Network *)
          std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 *)local_40);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                                       *)&nwk), bVar2) {
      pNVar3 = __gnu_cxx::
               __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
               ::operator*(&__end3);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(aRet,&pNVar3->mXpan);
      __gnu_cxx::
      __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
      ::operator++(&__end3);
    }
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             *)local_40);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkXpansByAliases(const StringArray     &aAliases,
                                                    std::vector<uint64_t> &aRet,
                                                    StringArray           &aUnresolved)
{
    NetworkArray     networks;
    Registry::Status status = GetNetworksByAliases(aAliases, networks, aUnresolved);

    if (status == Registry::Status::kSuccess)
    {
        for (const auto &nwk : networks)
        {
            aRet.push_back(nwk.mXpan);
        }
    }
    return status;
}